

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var.cpp
# Opt level: O2

double __thiscall IntVar::getScore(IntVar *this,VarBranch vb)

{
  int iVar1;
  iterator *piVar2;
  IntVar *in_RDX;
  longdouble in_ST0;
  double dVar3;
  iterator local_18;
  
  switch(vb) {
  case VAR_SIZE_MIN:
    iVar1 = (this->min).v;
    goto LAB_0012df64;
  case VAR_SIZE_MAX:
    iVar1 = (this->max).v;
    goto LAB_0012df88;
  case VAR_MIN_MIN:
    iVar1 = 0;
    goto LAB_0012df88;
  case VAR_MIN_MAX:
    dVar3 = (double)(this->min).v;
    break;
  case VAR_MAX_MIN:
    iVar1 = 0;
LAB_0012df64:
    iVar1 = iVar1 - (this->max).v;
    goto LAB_0012df8b;
  case VAR_MAX_MAX:
    dVar3 = (double)(this->max).v;
    break;
  case VAR_DEGREE_MIN:
    dVar3 = (double)((ulong)(double)(this->pinfo).sz | (ulong)DAT_001aeca0);
    break;
  case VAR_DEGREE_MAX:
    dVar3 = (double)(this->pinfo).sz;
    break;
  case VAR_REGRET_MIN_MAX:
    local_18.val = (this->min).v;
    if (local_18.val == (this->max).v) {
      return 0.0;
    }
    if (this->vals == (Tchar *)0x0) {
      return 1.0;
    }
    local_18.var = this;
    piVar2 = iterator::operator++(&local_18);
    iVar1 = piVar2->val;
LAB_0012df88:
    iVar1 = iVar1 - (this->min).v;
LAB_0012df8b:
    dVar3 = (double)iVar1;
    break;
  default:
    fprintf(_stderr,"%s:%d: ","int-var.cpp",0x102);
    fwrite("Not yet supported\n",0x12,1,_stderr);
    abort();
  case VAR_REDUCED_COST:
    MIP::getRC((longdouble *)mip,(MIP *)this,in_RDX);
    dVar3 = (double)in_ST0;
    break;
  case VAR_ACTIVITY:
    dVar3 = this->activity;
  }
  return dVar3;
}

Assistant:

double IntVar::getScore(VarBranch vb) {
	switch (vb) {
		case VAR_MIN_MIN:
			return -min;
		case VAR_MIN_MAX:
			return min;
		case VAR_MAX_MIN:
			return -max;
		case VAR_MAX_MAX:
			return max;
#if INT_BRANCH_HOLES
		// note slight inconsistency, if INT_BRANCH_HOLES=0 then we
		// use the domain size-1, same behaviour but more efficient?
		case VAR_SIZE_MIN:
			return vals ? -size() : min - (max + 1);
		case VAR_SIZE_MAX:
			return vals ? size() : max + 1 - min;
#else
		case VAR_SIZE_MIN:
			return min - max;
		case VAR_SIZE_MAX:
			return max - min;
#endif
		case VAR_DEGREE_MIN:
			return -static_cast<double>(pinfo.size());
		case VAR_DEGREE_MAX:
			return pinfo.size();
		case VAR_REDUCED_COST:
			return mip->getRC(this);
		case VAR_ACTIVITY:
			return activity;
		case VAR_REGRET_MIN_MAX:
			return isFixed() ? 0 : (vals != nullptr ? *++begin() - *begin() : 1);
#ifdef HAS_VAR_IMPACT
		case VAR_IMPACT:
			return isFixed() ? 0 : impact;
#endif

		default:
			NOT_SUPPORTED;
	}
}